

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int32_t __thiscall icu_63::UnicodeSet::hashCode(UnicodeSet *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = this->len;
  lVar2 = (long)iVar1;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      iVar1 = iVar1 * 0xf4243 + this->list[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int32_t UnicodeSet::hashCode(void) const {
    uint32_t result = static_cast<uint32_t>(len);
    for (int32_t i = 0; i < len; ++i) {
        result *= 1000003u;
        result += list[i];
    }
    return static_cast<int32_t>(result);
}